

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_writer.cpp
# Opt level: O0

void __thiscall diffusion::ShmWriter::cyclic_write(ShmWriter *this,char *data,size_t size)

{
  int local_44;
  Size bytes_can_be_written_without_wrap;
  Size space_left;
  char *start_position_unwritten_bytes;
  Size bytes_left;
  size_t size_local;
  char *data_local;
  ShmWriter *this_local;
  
  start_position_unwritten_bytes._4_4_ = (int)size;
  while (0 < start_position_unwritten_bytes._4_4_) {
    local_44 = this->shm_body_size_ - this->writer_shm_body_offset_;
    if (start_position_unwritten_bytes._4_4_ <= local_44) {
      local_44 = start_position_unwritten_bytes._4_4_;
    }
    memcpy(this->shm_body_position_ + (int)this->writer_shm_body_offset_,
           data + (size - (long)start_position_unwritten_bytes._4_4_),(long)local_44);
    this->writer_shm_body_offset_ = local_44 + this->writer_shm_body_offset_;
    start_position_unwritten_bytes._4_4_ = start_position_unwritten_bytes._4_4_ - local_44;
    if (this->writer_shm_body_offset_ == this->shm_body_size_) {
      this->writer_shm_body_offset_ = 0;
    }
  }
  return;
}

Assistant:

void ShmWriter::cyclic_write(char const *data, std::size_t size) {
    auto bytes_left = static_cast<Size>(size);
    while (bytes_left > 0) {
        auto start_position_unwritten_bytes = data + size - bytes_left;
        auto space_left = shm_body_size_ - static_cast<Size>(writer_shm_body_offset_);
        auto bytes_can_be_written_without_wrap = (bytes_left > space_left) ? space_left : bytes_left;
        std::memcpy(shm_body_position_ + static_cast<Offset>(writer_shm_body_offset_), start_position_unwritten_bytes, bytes_can_be_written_without_wrap);
        writer_shm_body_offset_ += bytes_can_be_written_without_wrap;
        bytes_left -= bytes_can_be_written_without_wrap;
        if (static_cast<Size>(writer_shm_body_offset_) == shm_body_size_) {
            writer_shm_body_offset_ = 0;
        }
    }
}